

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

int __thiscall
bv::internal::bt_impl<2048UL,_(bv::allocation_policy_t)0>::access
          (bt_impl<2048UL,_(bv::allocation_policy_t)0> *this,char *__name,int __type)

{
  ulong uVar1;
  int iVar2;
  leaf_reference pbVar3;
  int __type_00;
  pair<unsigned_long,_unsigned_long> pVar4;
  size_t in_stack_00000018;
  subtree_ref_base<true> local_48;
  
  if (in_stack_00000018 == 0) {
    pbVar3 = subtree_ref_base<true>::leaf((subtree_ref_base<true> *)&stack0x00000008);
    uVar1 = (pbVar3->_container)._M_elems[(ulong)__name >> 6];
    iVar2 = (int)CONCAT71((int7)(uVar1 >> 8),(uVar1 >> ((ulong)__name & 0x3f) & 1) != 0);
  }
  else {
    pVar4 = subtree_ref_base<true>::find((subtree_ref_base<true> *)&stack0x00000008,(size_t)__name);
    subtree_ref_base<true>::child(&local_48,(subtree_ref_base<true> *)&stack0x00000008,pVar4.first);
    iVar2 = access(this,(char *)pVar4.second,__type_00);
  }
  return iVar2;
}

Assistant:

bool bt_impl<W, AP>::access(subtree_const_ref t, size_t index) const
        {
            assert(index < t.size() && "Index out of bounds");
            
            if(t.is_leaf()) // We have a leaf
                return t.leaf()[index];
            else { // We're in a node
                size_t child, new_index;
                tie(child, new_index) = t.find(index);
                
                return access(t.child(child), new_index);
            }
        }